

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3PagerExclusiveLock(Pager *pPager)

{
  int iVar1;
  Pager *in_RDI;
  int rc;
  int in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  int iVar2;
  
  iVar2 = 0;
  iVar1 = pagerUseWal(in_RDI);
  if (iVar1 == 0) {
    iVar2 = pager_wait_on_lock((Pager *)CONCAT44(iVar2,in_stack_fffffffffffffff0),
                               in_stack_ffffffffffffffec);
  }
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3PagerExclusiveLock(Pager *pPager){
  int rc = SQLITE_OK;
  assert( pPager->eState==PAGER_WRITER_CACHEMOD 
       || pPager->eState==PAGER_WRITER_DBMOD 
       || pPager->eState==PAGER_WRITER_LOCKED 
  );
  assert( assert_pager_state(pPager) );
  if( 0==pagerUseWal(pPager) ){
    rc = pager_wait_on_lock(pPager, EXCLUSIVE_LOCK);
  }
  return rc;
}